

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

bool deqp::egl::Image::isCompatibleFormats
               (GLenum createFormat,GLenum modifyFormat,GLenum modifyType)

{
  bool local_2d;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  bool local_24;
  bool local_23;
  bool local_22;
  bool local_21;
  GLenum modifyType_local;
  GLenum modifyFormat_local;
  GLenum createFormat_local;
  
  if (modifyFormat == 0x1907) {
    if (modifyType == 0x1400) {
      modifyFormat_local._3_1_ = createFormat == 0x8f96;
    }
    else if (modifyType == 0x1401) {
      local_21 = true;
      if (((createFormat != 0x1907) && (local_21 = true, createFormat != 0x8051)) &&
         (local_21 = true, createFormat != 0x8d62)) {
        local_21 = createFormat == 0x8c41;
      }
      modifyFormat_local._3_1_ = local_21;
    }
    else if (modifyType == 0x1406) {
      local_24 = true;
      if (((createFormat != 0x881b) && (local_24 = true, createFormat != 0x8815)) &&
         (local_24 = true, createFormat != 0x8c3a)) {
        local_24 = createFormat == 0x8c3d;
      }
      modifyFormat_local._3_1_ = local_24;
    }
    else if (modifyType == 0x140b) {
      local_23 = true;
      if ((createFormat != 0x881b) && (local_23 = true, createFormat != 0x8c3a)) {
        local_23 = createFormat == 0x8c3d;
      }
      modifyFormat_local._3_1_ = local_23;
    }
    else if (modifyType == 0x8363) {
      local_22 = createFormat == 0x1907 || createFormat == 0x8d62;
      modifyFormat_local._3_1_ = local_22;
    }
    else if (modifyType == 0x8c3b) {
      modifyFormat_local._3_1_ = createFormat == 0x8c3a;
    }
    else if (modifyType == 0x8c3e) {
      modifyFormat_local._3_1_ = createFormat == 0x8c3d;
    }
    else {
      modifyFormat_local._3_1_ = false;
    }
  }
  else if (modifyFormat == 0x1908) {
    if (modifyType == 0x1401) {
      local_29 = true;
      if ((((createFormat != 0x8058) && (local_29 = true, createFormat != 0x8057)) &&
          (local_29 = true, createFormat != 0x8056)) && (local_29 = true, createFormat != 0x8c43)) {
        local_29 = createFormat == 0x1908;
      }
      modifyFormat_local._3_1_ = local_29;
    }
    else if (modifyType == 0x1406) {
      local_2d = createFormat == 0x881a || createFormat == 0x8814;
      modifyFormat_local._3_1_ = local_2d;
    }
    else if (modifyType == 0x140b) {
      modifyFormat_local._3_1_ = createFormat == 0x881a;
    }
    else if (modifyType == 0x8033) {
      local_2a = createFormat == 0x8056 || createFormat == 0x1908;
      modifyFormat_local._3_1_ = local_2a;
    }
    else if (modifyType == 0x8034) {
      local_2b = createFormat == 0x8057 || createFormat == 0x1908;
      modifyFormat_local._3_1_ = local_2b;
    }
    else if (modifyType == 0x8368) {
      local_2c = createFormat == 0x8059 || createFormat == 0x8057;
      modifyFormat_local._3_1_ = local_2c;
    }
    else {
      modifyFormat_local._3_1_ = false;
    }
  }
  else {
    modifyFormat_local._3_1_ = false;
  }
  return modifyFormat_local._3_1_;
}

Assistant:

bool isCompatibleFormats (GLenum createFormat, GLenum modifyFormat, GLenum modifyType)
{
	switch (modifyFormat)
	{
		case GL_RGB:
			switch (modifyType)
			{
				case GL_UNSIGNED_BYTE:
					return createFormat == GL_RGB
							|| createFormat == GL_RGB8
							|| createFormat == GL_RGB565
							|| createFormat == GL_SRGB8;

				case GL_BYTE:
					return createFormat == GL_RGB8_SNORM;

				case GL_UNSIGNED_SHORT_5_6_5:
					return createFormat == GL_RGB
							|| createFormat == GL_RGB565;

				case GL_UNSIGNED_INT_10F_11F_11F_REV:
					return createFormat == GL_R11F_G11F_B10F;

				case GL_UNSIGNED_INT_5_9_9_9_REV:
					return createFormat == GL_RGB9_E5;

				case GL_HALF_FLOAT:
					return createFormat == GL_RGB16F
							|| createFormat == GL_R11F_G11F_B10F
							|| createFormat == GL_RGB9_E5;

				case GL_FLOAT:
					return createFormat == GL_RGB16F
							|| createFormat == GL_RGB32F
							|| createFormat == GL_R11F_G11F_B10F
							|| createFormat == GL_RGB9_E5;

				default:
					DE_FATAL("Unknown modify type");
					return false;
			}

		case GL_RGBA:
			switch (modifyType)
			{
				case GL_UNSIGNED_BYTE:
					return createFormat == GL_RGBA8
						|| createFormat == GL_RGB5_A1
						|| createFormat == GL_RGBA4
						|| createFormat == GL_SRGB8_ALPHA8
						|| createFormat == GL_RGBA;

				case GL_UNSIGNED_SHORT_4_4_4_4:
					return createFormat == GL_RGBA4
						|| createFormat == GL_RGBA;

				case GL_UNSIGNED_SHORT_5_5_5_1:
					return createFormat == GL_RGB5_A1
						|| createFormat == GL_RGBA;

				case GL_UNSIGNED_INT_2_10_10_10_REV:
					return createFormat == GL_RGB10_A2
						|| createFormat == GL_RGB5_A1;

				case GL_HALF_FLOAT:
					return createFormat == GL_RGBA16F;

				case GL_FLOAT:
					return createFormat == GL_RGBA16F
						|| createFormat == GL_RGBA32F;

				default:
					DE_FATAL("Unknown modify type");
					return false;
			};

		default:
			DE_FATAL("Unknown modify format");
			return false;
	}
}